

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode ZSTD_XXH32_update(XXH32_state_t *state,void *input,size_t len)

{
  uint uVar1;
  XXH32_hash_t XVar2;
  ulong uVar3;
  XXH32_hash_t XVar4;
  XXH32_hash_t XVar5;
  XXH32_hash_t XVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  
  if (input != (void *)0x0) {
    uVar1 = state->total_len_32 + (int)len;
    state->total_len_32 = uVar1;
    state->large_len = state->large_len | (uint)(0xf < uVar1 || 0xf < len);
    uVar3 = (ulong)state->memsize;
    if (uVar3 + len < 0x10) {
      memcpy((void *)((long)state->mem32 + uVar3),input,len);
      XVar2 = state->memsize + (int)len;
    }
    else {
      piVar7 = (int *)(len + (long)input);
      if (uVar3 != 0) {
        memcpy((void *)((long)state->mem32 + uVar3),input,(ulong)(0x10 - state->memsize));
        auVar8 = *(undefined1 (*) [16])state->mem32;
        uVar1 = auVar8._0_4_ * -0x7a143589 + state->v[0];
        uVar10 = auVar8._4_4_ * -0x7a143589 + state->v[1];
        uVar12 = (int)((auVar8._8_8_ & 0xffffffff) * 0x85ebca77) + state->v[2];
        uVar13 = auVar8._12_4_ * -0x7a143589 + state->v[3];
        auVar8._0_4_ = uVar1 >> 0x13;
        auVar8._4_4_ = uVar10 >> 0x13;
        auVar8._8_4_ = uVar12 >> 0x13;
        auVar8._12_4_ = uVar13 >> 0x13;
        auVar9._0_4_ = uVar1 * 0x2000;
        auVar9._4_4_ = uVar10 * 0x2000;
        auVar9._8_4_ = uVar12 * 0x2000;
        auVar9._12_4_ = uVar13 * 0x2000;
        auVar9 = auVar9 | auVar8;
        iVar11 = auVar9._4_4_;
        auVar14._4_4_ = iVar11;
        auVar14._0_4_ = iVar11;
        auVar14._8_4_ = auVar9._12_4_;
        auVar14._12_4_ = auVar9._12_4_;
        *(ulong *)state->v = CONCAT44(iVar11 * -0x61c8864f,auVar9._0_4_ * -0x61c8864f);
        state->mem32[0] = (XXH32_hash_t)((auVar9._8_8_ & 0xffffffff) * 0x9e3779b1);
        state->mem32[1] = (XXH32_hash_t)((auVar14._8_8_ & 0xffffffff) * 0x9e3779b1);
        input = (void *)((long)input + (ulong)(0x10 - state->memsize));
        state->memsize = 0;
      }
      if (input <= piVar7 + -4) {
        XVar2 = state->v[0];
        XVar4 = state->v[1];
        XVar5 = state->v[2];
        XVar6 = state->v[3];
        do {
          uVar1 = *input * -0x7a143589 + XVar2;
          XVar2 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
          state->v[0] = XVar2;
          uVar1 = *(int *)((long)input + 4) * -0x7a143589 + XVar4;
          XVar4 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
          state->v[1] = XVar4;
          uVar1 = *(int *)((long)input + 8) * -0x7a143589 + XVar5;
          XVar5 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
          state->v[2] = XVar5;
          uVar1 = *(int *)((long)input + 0xc) * -0x7a143589 + XVar6;
          XVar6 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
          state->v[3] = XVar6;
          input = (void *)((long)input + 0x10);
        } while (input <= piVar7 + -4);
      }
      if (piVar7 <= input) {
        return XXH_OK;
      }
      memcpy(state->mem32,input,(long)piVar7 - (long)input);
      XVar2 = (XXH32_hash_t)((long)piVar7 - (long)input);
    }
    state->memsize = XVar2;
  }
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH32_update(XXH32_state_t* state, const void* input, size_t len)
{
    if (input==NULL) {
        XXH_ASSERT(len == 0);
        return XXH_OK;
    }

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len_32 += (XXH32_hash_t)len;
        state->large_len |= (XXH32_hash_t)((len>=16) | (state->total_len_32>=16));

        if (state->memsize + len < 16)  {   /* fill in tmp buffer */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, len);
            state->memsize += (XXH32_hash_t)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* some data left from previous update */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, 16-state->memsize);
            {   const xxh_u32* p32 = state->mem32;
                state->v[0] = XXH32_round(state->v[0], XXH_readLE32(p32)); p32++;
                state->v[1] = XXH32_round(state->v[1], XXH_readLE32(p32)); p32++;
                state->v[2] = XXH32_round(state->v[2], XXH_readLE32(p32)); p32++;
                state->v[3] = XXH32_round(state->v[3], XXH_readLE32(p32));
            }
            p += 16-state->memsize;
            state->memsize = 0;
        }

        if (p <= bEnd-16) {
            const xxh_u8* const limit = bEnd - 16;

            do {
                state->v[0] = XXH32_round(state->v[0], XXH_readLE32(p)); p+=4;
                state->v[1] = XXH32_round(state->v[1], XXH_readLE32(p)); p+=4;
                state->v[2] = XXH32_round(state->v[2], XXH_readLE32(p)); p+=4;
                state->v[3] = XXH32_round(state->v[3], XXH_readLE32(p)); p+=4;
            } while (p<=limit);

        }

        if (p < bEnd) {
            XXH_memcpy(state->mem32, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}